

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

AllocatedBlock * __thiscall ctemplate::BaseArena::AllocNewBlock(BaseArena *this,size_t block_size)

{
  int iVar1;
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar2;
  size_type sVar3;
  size_t size;
  void *pvVar4;
  size_t new_block_size;
  size_t num_pages;
  AllocatedBlock *block;
  size_t block_size_local;
  BaseArena *this_local;
  
  if ((uint)this->blocks_alloced_ < 0x10) {
    iVar1 = this->blocks_alloced_;
    this->blocks_alloced_ = iVar1 + 1;
    num_pages = (size_t)(this->first_blocks_ + iVar1);
  }
  else {
    if (this->overflow_blocks_ ==
        (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
         *)0x0) {
      pvVar2 = (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                *)operator_new(0x18);
      std::
      vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
      ::vector(pvVar2);
      this->overflow_blocks_ = pvVar2;
    }
    pvVar2 = this->overflow_blocks_;
    sVar3 = std::
            vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
            ::size(this->overflow_blocks_);
    std::
    vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
    ::resize(pvVar2,sVar3 + 1);
    num_pages = (size_t)std::
                        vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                        ::back(this->overflow_blocks_);
  }
  if ((this->page_aligned_ & 1U) == 0) {
    pvVar4 = malloc(block_size);
    *(void **)num_pages = pvVar4;
    *(size_t *)(num_pages + 8) = block_size;
  }
  else {
    size = ((block_size - 1 >> 0xd) + 1) * 0x2000;
    pvVar4 = aligned_malloc(size,0x2000);
    *(void **)num_pages = pvVar4;
    if (*(long *)num_pages == 0) {
      fprintf(_stderr,"Check failed: %s\n","__null != block->mem");
      exit(1);
    }
    *(size_t *)(num_pages + 8) = size;
  }
  (this->status_).bytes_allocated_ = block_size + (this->status_).bytes_allocated_;
  return (AllocatedBlock *)num_pages;
}

Assistant:

BaseArena::AllocatedBlock*  BaseArena::AllocNewBlock(const size_t block_size) {
  AllocatedBlock *block;
  // Find the next block.
  if ( blocks_alloced_ < ARRAYSIZE(first_blocks_) ) {
    // Use one of the pre-allocated blocks
    block = &first_blocks_[blocks_alloced_++];
  } else {                   // oops, out of space, move to the vector
    if (overflow_blocks_ == NULL) overflow_blocks_ = new vector<AllocatedBlock>;
    // Adds another block to the vector.
    overflow_blocks_->resize(overflow_blocks_->size()+1);
    // block points to the last block of the vector.
    block = &overflow_blocks_->back();
  }

  if (page_aligned_) {
    // We need the size to be multiple of kPageSize to mprotect it later.
    size_t num_pages = ((block_size - 1) / kPageSize) + 1;
    size_t new_block_size = num_pages * kPageSize;
    block->mem = reinterpret_cast<char*>(aligned_malloc(new_block_size,
                                                        kPageSize));
    PCHECK(NULL != block->mem);
    block->size = new_block_size;
  } else {
    block->mem = reinterpret_cast<char*>(malloc(block_size));
    block->size = block_size;
  }

  ARENASET(status_.bytes_allocated_ += block_size);

  return block;
}